

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1029e4::StatTestSimple::Run(StatTestSimple *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *this_00;
  string err;
  string local_50;
  
  iVar4 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_StatTest).super_StateTestWithBuiltinRules.state_,"build out: cat in\n",
              (ManifestParserOptions)0x0);
  if (iVar4 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out","");
  this_00 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pTVar2 = g_current_test;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = Node::Stat(this_00,&(this->super_StatTest).super_DiskInterface,&local_50);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x110,"out->Stat(this, &err)");
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_50);
  testing::Test::Check
            (pTVar2,iVar4 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x111,"\"\" == err");
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x20,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x112,"1u == stats_.size()");
  if (bVar3) {
    DependencyScan::RecomputeDirty
              (&(this->super_StatTest).scan_,this_00,(vector<Node_*,_std::allocator<Node_*>_> *)0x0,
               (string *)0x0);
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_StatTest).stats_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_StatTest).stats_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x40,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                       ,0x114,"2u == stats_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(this->super_StatTest).stats_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      bVar3 = testing::Test::Check
                        (pTVar2,iVar4 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                         ,0x115,"\"out\" == stats_[0]");
      pTVar2 = g_current_test;
      if (bVar3) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((this->super_StatTest).stats_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        bVar3 = testing::Test::Check
                          (pTVar2,iVar4 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                           ,0x116,"\"in\" == stats_[1]");
        if (bVar3) goto LAB_00166cad;
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00166cad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(StatTest, Simple) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_EQ(2u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_EQ("in",  stats_[1]);
}